

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_decoder.hpp
# Opt level: O1

void __thiscall duckdb::RleBpDecoder::NextCountsTemplated<true>(RleBpDecoder *this)

{
  uint64_t *puVar1;
  uint uVar2;
  ulong uVar3;
  runtime_error *this_00;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  
  if (this->bitpack_pos != '\0') {
    ByteBuffer::available(&this->buffer_,1);
    puVar1 = &(this->buffer_).len;
    *puVar1 = *puVar1 - 1;
    (this->buffer_).ptr = (this->buffer_).ptr + 1;
    this->bitpack_pos = '\0';
  }
  uVar2 = ParquetDecodeUtils::VarintDecode<unsigned_int,true>(&this->buffer_);
  if ((uVar2 & 1) == 0) {
    this->repeat_count_ = uVar2 >> 1;
    this->current_value_ = 0;
    ByteBuffer::available(&this->buffer_,(ulong)this->byte_encoded_len);
    uVar3 = (ulong)this->byte_encoded_len;
    if (uVar3 != 0) {
      pbVar5 = (this->buffer_).ptr;
      uVar6 = this->current_value_;
      uVar4 = 0;
      do {
        uVar6 = uVar6 | (long)(int)((uint)*pbVar5 << ((byte)uVar4 & 0x1f));
        this->current_value_ = uVar6;
        uVar4 = uVar4 + 8;
        pbVar5 = pbVar5 + 1;
      } while ((uint)this->byte_encoded_len * 8 != uVar4);
    }
    puVar1 = &(this->buffer_).len;
    *puVar1 = *puVar1 - uVar3;
    (this->buffer_).ptr = (this->buffer_).ptr + uVar3;
    if ((this->repeat_count_ != 0) && (this->max_val < this->current_value_)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Payload value bigger than allowed. Corrupted file?");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    this->literal_count_ = (uVar2 & 0x3ffffffe) << 2;
  }
  return;
}

Assistant:

void NextCountsTemplated() {
		// Read the next run's indicator int, it could be a literal or repeated run.
		// The int is encoded as a vlq-encoded value.
		if (bitpack_pos != 0) {
			if (CHECKED) {
				buffer_.inc(1);
			} else {
				buffer_.unsafe_inc(1);
			}
			bitpack_pos = 0;
		}
		auto indicator_value = ParquetDecodeUtils::VarintDecode<uint32_t, CHECKED>(buffer_);

		// lsb indicates if it is a literal run or repeated run
		bool is_literal = indicator_value & 1;
		if (is_literal) {
			literal_count_ = (indicator_value >> 1) * 8;
		} else {
			repeat_count_ = indicator_value >> 1;
			// (ARROW-4018) this is not big-endian compatible, lol
			current_value_ = 0;
			if (CHECKED) {
				buffer_.available(byte_encoded_len);
			}
			for (auto i = 0; i < byte_encoded_len; i++) {
				auto next_byte = Load<uint8_t>(buffer_.ptr + i);
				current_value_ |= (next_byte << (i * 8));
			}
			buffer_.unsafe_inc(byte_encoded_len);
			// sanity check
			if (repeat_count_ > 0 && current_value_ > max_val) {
				throw std::runtime_error("Payload value bigger than allowed. Corrupted file?");
			}
		}
	}